

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-alloc-cb-fail.c
# Opt level: O0

void conn_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *stream_local;
  
  if (nread != -0x69) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-alloc-cb-fail.c"
            ,0x37,"nread","==","UV_ENOBUFS",nread,"==",0xffffffffffffff97);
    abort();
  }
  if (buf->base != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-alloc-cb-fail.c"
            ,0x38,"buf->base","==","NULL",buf->base,"==",0);
    abort();
  }
  if (buf->len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-alloc-cb-fail.c"
            ,0x39,"buf->len","==","0",buf->len,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)&incoming,close_cb);
  uv_close((uv_handle_t *)&client,close_cb);
  uv_close((uv_handle_t *)&server,close_cb);
  return;
}

Assistant:

static void conn_read_cb(uv_stream_t* stream,
                         ssize_t nread,
                         const uv_buf_t* buf) {
  ASSERT_EQ(nread, UV_ENOBUFS);
  ASSERT_NULL(buf->base);
  ASSERT_OK(buf->len);

  uv_close((uv_handle_t*) &incoming, close_cb);
  uv_close((uv_handle_t*) &client, close_cb);
  uv_close((uv_handle_t*) &server, close_cb);
}